

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRelConnects::~IfcRelConnects(IfcRelConnects *this)

{
  ~IfcRelConnects((IfcRelConnects *)&this[-1].super_IfcRelationship.super_IfcRoot.field_0x28);
  return;
}

Assistant:

IfcRelConnects() : Object("IfcRelConnects") {}